

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS TestWhiteSpace(_Bool IsJson5)

{
  WJTL_STATUS WVar1;
  _Bool _result_21;
  uint64_t uStack_50;
  _Bool _result_20;
  undefined8 local_48;
  byte local_3a;
  byte local_39;
  _Bool _result_19;
  uint64_t uStack_38;
  _Bool _result_18;
  undefined8 local_30;
  byte local_22;
  byte local_21;
  byte local_20;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  byte local_1c;
  byte local_1b;
  _Bool _result_17;
  _Bool _result_16;
  _Bool _result_15;
  _Bool _result_14;
  _Bool _result_13;
  _Bool _result_12;
  _Bool _result_11;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  WJTL_STATUS TestReturn;
  _Bool IsJson5_local;
  
  __result_7 = WJTL_STATUS_SUCCESS;
  _result = IsJson5;
  WVar1 = VerifyJsonParsesAsNumberObjectSigned(IsJson5," 1 ",1);
  _result_8 = WVar1 == WJTL_STATUS_SUCCESS;
  WjTestLib_Assert(_result_8,
                   "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \" 1 \", 1 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestWhiteSpace",0x4e9);
  if ((_result_8 & 1U) == 0) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonParsesAsNumberObjectSigned((_Bool)(_result & 1),"\t1\t",1);
  _result_9 = WVar1 == WJTL_STATUS_SUCCESS;
  WjTestLib_Assert(_result_9,
                   "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \"\\t1\\t\", 1 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestWhiteSpace",0x4ea);
  if ((_result_9 & 1U) == 0) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonParsesAsNumberObjectSigned((_Bool)(_result & 1),"\n1\n",1);
  _result_10 = WVar1 == WJTL_STATUS_SUCCESS;
  WjTestLib_Assert(_result_10,
                   "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \"\\n1\\n\", 1 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestWhiteSpace",0x4eb);
  if ((_result_10 & 1U) == 0) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonParsesAsNumberObjectSigned((_Bool)(_result & 1),"\r\n1\r\n",1);
  _result_11 = WVar1 == WJTL_STATUS_SUCCESS;
  WjTestLib_Assert(_result_11,
                   "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \"\\r\\n1\\r\\n\", 1 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestWhiteSpace",0x4ec);
  if ((_result_11 & 1U) == 0) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  if ((_result & 1U) == 0) {
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1)," 1\v",1);
    local_1b = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert((_Bool)local_1b,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \" 1\\v\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4fb);
    if ((local_1b & 1) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1)," 1\f",1);
    local_1c = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert((_Bool)local_1c,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \" 1\\f\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4fc);
    if ((local_1c & 1) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),anon_var_dwarf_2045,1);
    local_1d = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert((_Bool)local_1d,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \" 1\\xc2\\xa0\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4fd);
    if ((local_1d & 1) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),anon_var_dwarf_2069,1);
    local_1e = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert((_Bool)local_1e,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \" 1\\xe2\\x80\\xa8\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4fe);
    if ((local_1e & 1) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),anon_var_dwarf_2081,1);
    local_1f = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert((_Bool)local_1f,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \" 1\\xe2\\x80\\xa9\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4ff);
    if ((local_1f & 1) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),anon_var_dwarf_2099,1);
    local_20 = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert((_Bool)local_20,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \" 1\\xef\\xbb\\xbf\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x500);
    if ((local_20 & 1) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
  }
  else {
    WVar1 = VerifyJsonParsesAsNumberObjectSigned((_Bool)(_result & 1)," \v1\v",1);
    _result_12 = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert(_result_12,
                     "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \" \\v1\\v\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4f1);
    if ((_result_12 & 1U) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsNumberObjectSigned((_Bool)(_result & 1)," \f1\f",1);
    _result_13 = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert(_result_13,
                     "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \" \\f1\\f\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4f2);
    if ((_result_13 & 1U) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsNumberObjectSigned((_Bool)(_result & 1),anon_var_dwarf_1fb5,1);
    _result_14 = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert(_result_14,
                     "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \" \\xc2\\xa0 1 \\xc2\\xa0\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4f3);
    if ((_result_14 & 1U) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsNumberObjectSigned((_Bool)(_result & 1),anon_var_dwarf_1fcd,1);
    _result_15 = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert(_result_15,
                     "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \" \\xe2\\x80\\xa8 1 \\xe2\\x80\\xa8\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4f4);
    if ((_result_15 & 1U) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsNumberObjectSigned((_Bool)(_result & 1),anon_var_dwarf_1fe5,1);
    _result_16 = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert(_result_16,
                     "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \" \\xe2\\x80\\xa9 1 \\xe2\\x80\\xa9\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4f5);
    if ((_result_16 & 1U) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsNumberObjectSigned((_Bool)(_result & 1),anon_var_dwarf_1ffd,1);
    _result_17 = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert(_result_17,
                     "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \" \\xef\\xbb\\xbf 1 \\xef\\xbb\\xbf\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4f6);
    if ((_result_17 & 1U) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
  }
  WVar1 = VerifyJsonParsesAsDictionaryOfNumbers
                    ((_Bool)(_result & 1),
                     " {  \t\r\n\"item1\"  \t\r\n:  \t\r\n1,  \t\r\n\"item2\"  \t\r\n:  \t\r\n2  \t\r\n}"
                     ,2);
  local_21 = WVar1 == WJTL_STATUS_SUCCESS;
  WjTestLib_Assert((_Bool)local_21,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \"\" \\t\\r\\n\"\"\\\"item1\\\" \"\" \\t\\r\\n\"\": \"\" \\t\\r\\n\"\"1, \"\" \\t\\r\\n\"\"\\\"item2\\\" \"\" \\t\\r\\n\"\": \"\" \\t\\r\\n\"\"2 \"\" \\t\\r\\n\"\"}\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestWhiteSpace",0x506);
  if ((local_21 & 1) == 0) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  uStack_38 = 1;
  local_30 = 2;
  WVar1 = VerifyJsonParsesAsListOfNumbers
                    ((_Bool)(_result & 1)," \t\r\n[ \t\r\n1 \t\r\n, \t\r\n2 \t\r\n] \t\r\n",
                     &stack0xffffffffffffffc8,2);
  local_22 = WVar1 == WJTL_STATUS_SUCCESS;
  WjTestLib_Assert((_Bool)local_22,
                   "((JL_STATUS)(VerifyJsonParsesAsListOfNumbers( IsJson5, \"\"\" \\t\\r\\n\"\"[\"\" \\t\\r\\n\"\"1\"\" \\t\\r\\n\"\",\"\" \\t\\r\\n\"\"2\"\" \\t\\r\\n\"\"]\"\" \\t\\r\\n\"\"\", (uint64_t[]){1,2}, 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestWhiteSpace",0x507);
  if ((local_22 & 1) == 0) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  if ((_result & 1U) == 0) {
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),anon_var_dwarf_2105,7);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \" { \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"\\\"item1\\\" \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\": \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"1, \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"\\\"item2\\\" \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\": \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"2 \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"}\", 7 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x50f);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),anon_var_dwarf_2136,4);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"[\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"1\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\",\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"2\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"]\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"\", 4 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x510);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
  }
  else {
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers((_Bool)(_result & 1),anon_var_dwarf_2105,2);
    local_39 = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert((_Bool)local_39,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"\\\"item1\\\" \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\": \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"1, \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"\\\"item2\\\" \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\": \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"2 \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"}\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x50a);
    if ((local_39 & 1) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    uStack_50 = 1;
    local_48 = 2;
    WVar1 = VerifyJsonParsesAsListOfNumbers
                      ((_Bool)(_result & 1),anon_var_dwarf_2136,&stack0xffffffffffffffb0,2);
    local_3a = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert((_Bool)local_3a,
                     "((JL_STATUS)(VerifyJsonParsesAsListOfNumbers( IsJson5, \"\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"[\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"1\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\",\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"2\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"]\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"\", (uint64_t[]){1,2}, 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x50b);
    if ((local_3a & 1) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
  }
  return __result_7;
}

Assistant:

static
WJTL_STATUS
    TestWhiteSpace
    (
        bool            IsJson5
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    // Test ordinary whitespace
    JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, " 1 ", 1 ) );          // Space
    JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, "\t1\t", 1 ) );        // Tab
    JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, "\n1\n", 1 ) );        // Line feed
    JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, "\r\n1\r\n", 1 ) );    // Carriage return / Line feed

    // Now test extended json5 whitespace
    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, " \v1\v", 1 ) );             // Vertical tab
        JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, " \f1\f", 1 ) );             // Form feed
        JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, " \xc2\xa0 1 \xc2\xa0", 1 ) );       // Non-breaking space
        JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, " \xe2\x80\xa8 1 \xe2\x80\xa8", 1 ) );   // Line separator
        JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, " \xe2\x80\xa9 1 \xe2\x80\xa9", 1 ) );   // Paragraph separator
        JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, " \xef\xbb\xbf 1 \xef\xbb\xbf", 1 ) );   // Byte order mark
    }
    else
    {
        // Extended white spaces should fail
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 1\v", 1 ) );             // Vertical tab
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 1\f", 1 ) );             // Form feed
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 1\xc2\xa0", 1 ) );       // Non-breaking space
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 1\xe2\x80\xa8", 1 ) );   // Line separator
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 1\xe2\x80\xa9", 1 ) );   // Paragraph separator
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 1\xef\xbb\xbf", 1 ) );   // Byte order mark
    }

    // Now try a more complicated object with all the white spaces used
    #define WSP1 " \t\r\n"
    #define WSP5 " \t\r\n\xc2\xa0 \xe2\x80\xa8 \xe2\x80\xa9 \xef\xbb\xbf"
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { "WSP1"\"item1\" "WSP1": "WSP1"1, "WSP1"\"item2\" "WSP1": "WSP1"2 "WSP1"}", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsListOfNumbers( IsJson5, ""WSP1"["WSP1"1"WSP1","WSP1"2"WSP1"]"WSP1"", (uint64_t[]){1,2}, 2 ) );
    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { "WSP5"\"item1\" "WSP5": "WSP5"1, "WSP5"\"item2\" "WSP5": "WSP5"2 "WSP5"}", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsListOfNumbers( IsJson5, ""WSP5"["WSP5"1"WSP5","WSP5"2"WSP5"]"WSP5"", (uint64_t[]){1,2}, 2 ) );
    }
    else
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " { "WSP5"\"item1\" "WSP5": "WSP5"1, "WSP5"\"item2\" "WSP5": "WSP5"2 "WSP5"}", 7 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, ""WSP5"["WSP5"1"WSP5","WSP5"2"WSP5"]"WSP5"", 4 ) );
    }
    #undef WSP5
    #undef WSP5

    return TestReturn;
}